

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O1

void BrotliSplitBlock(MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
                     size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
                     BlockSplit *insert_and_copy_split,BlockSplit *dist_split,
                     BlockSplitFromDecoder *literals_block_splits_decoder,
                     size_t *current_block_literals,BlockSplitFromDecoder *cmds_block_splits_decoder
                     ,size_t *current_block_cmds)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  ushort uVar4;
  size_t byte_ix;
  Command *pCVar5;
  void *pvVar6;
  ulong uVar7;
  uint8_t *puVar8;
  undefined1 *puVar9;
  void *pvVar10;
  ulong uVar11;
  ushort *puVar12;
  void *pvVar13;
  void *pvVar14;
  HistogramPair *pHVar15;
  void *pvVar16;
  HistogramCommand *out;
  BlockSplit *pBVar17;
  HistogramLiteral *pHVar18;
  BlockSplit *pBVar19;
  HistogramCommand *pHVar20;
  uint32_t *__dest;
  uint32_t *puVar21;
  uint32_t *puVar22;
  uint16_t *puVar23;
  int iVar24;
  size_t sVar25;
  long lVar26;
  ulong uVar27;
  uint32_t uVar28;
  byte *pbVar29;
  size_t block_idx_1;
  uint *puVar30;
  void *pvVar31;
  size_t __n;
  HistogramPair *pHVar32;
  byte bVar33;
  uint uVar34;
  byte bVar35;
  ulong uVar36;
  BlockSplit *pBVar37;
  HistogramPair *pHVar38;
  uint16_t *puVar39;
  uint uVar40;
  size_t __n_00;
  uint *puVar41;
  BrotliEncoderParams *pBVar42;
  size_t block_idx;
  long lVar43;
  void *pvVar44;
  long lVar45;
  ulong uVar46;
  size_t sVar47;
  double dVar48;
  double dVar49;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar50;
  BrotliEncoderParams *pBVar51;
  BlockSplit *in_stack_fffffffffffff000;
  long local_ff0;
  HistogramCommand *local_fe8;
  void *local_fe0;
  ulong local_fc8;
  void *local_fc0;
  void *local_fb8;
  uint32_t *local_fb0;
  HistogramLiteral *local_fa0;
  ulong local_f90;
  HistogramPair *local_f88;
  HistogramPair *local_f58;
  uint32_t new_clusters [64];
  uint32_t symbols [64];
  uint32_t sizes [64];
  uint32_t remap [64];
  undefined1 local_b40 [1032];
  double local_738;
  ulong local_40;
  double local_38;
  
  pHVar32 = (HistogramPair *)0x0;
  pCVar5 = cmds;
  sVar25 = num_commands;
  if (num_commands != 0) {
    do {
      pHVar32 = (HistogramPair *)((long)&pHVar32->idx1 + (ulong)pCVar5->insert_len_);
      sVar25 = sVar25 - 1;
      pCVar5 = pCVar5 + 1;
    } while (sVar25 != 0);
  }
  pHVar38 = pHVar32;
  if (pHVar32 == (HistogramPair *)0x0) {
    local_fe0 = (void *)0x0;
  }
  else {
    local_fe0 = BrotliAllocate(m,(size_t)pHVar32);
  }
  if (num_commands != 0) {
    puVar22 = &cmds->copy_len_;
    lVar43 = 0;
    sVar25 = num_commands;
    sVar47 = pos;
    do {
      uVar46 = sVar47 & mask;
      __n_00 = (size_t)((Command *)(puVar22 + -1))->insert_len_;
      if (mask < uVar46 + __n_00) {
        __n = (mask + 1) - uVar46;
        memcpy((void *)((long)local_fe0 + lVar43),data + uVar46,__n);
        lVar43 = lVar43 + __n;
        __n_00 = __n_00 - __n;
        uVar46 = 0;
      }
      if (__n_00 != 0) {
        memcpy((void *)((long)local_fe0 + lVar43),data + uVar46,__n_00);
        lVar43 = lVar43 + __n_00;
      }
      sVar47 = (ulong)(*puVar22 & 0x1ffffff) + __n_00 + uVar46;
      puVar22 = puVar22 + 4;
      sVar25 = sVar25 - 1;
    } while (sVar25 != 0);
  }
  pBVar42 = (BrotliEncoderParams *)m;
  if (literals_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    uVar46 = 100;
    if (pHVar32 < (HistogramPair *)0xd480) {
      uVar46 = (ulong)pHVar32 / 0x220 + 1;
    }
    if (pHVar32 == (HistogramPair *)0x0) {
      literal_split->num_types = 1;
    }
    else if (pHVar32 < (HistogramPair *)0x80) {
      uVar46 = literal_split->types_alloc_size;
      uVar7 = literal_split->num_blocks + 1;
      if (uVar46 < uVar7) {
        if (uVar46 == 0) {
          uVar46 = uVar7;
        }
        do {
          uVar36 = uVar46;
          uVar46 = uVar36 * 2;
        } while (uVar36 < uVar7);
        if (uVar36 == 0) {
          puVar8 = (uint8_t *)0x0;
        }
        else {
          puVar8 = (uint8_t *)BrotliAllocate(m,uVar36);
        }
        if (literal_split->types_alloc_size != 0) {
          memcpy(puVar8,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar8;
        literal_split->types_alloc_size = uVar36;
      }
      uVar46 = literal_split->lengths_alloc_size;
      uVar7 = literal_split->num_blocks + 1;
      if (uVar46 < uVar7) {
        if (uVar46 == 0) {
          uVar46 = uVar7;
        }
        do {
          uVar36 = uVar46;
          uVar46 = uVar36 * 2;
        } while (uVar36 < uVar7);
        if (uVar36 == 0) {
          puVar22 = (uint32_t *)0x0;
        }
        else {
          puVar22 = (uint32_t *)BrotliAllocate(m,uVar36 * 4);
        }
        if (literal_split->lengths_alloc_size != 0) {
          memcpy(puVar22,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar22;
        literal_split->lengths_alloc_size = uVar36;
      }
      literal_split->num_types = 1;
      literal_split->types[literal_split->num_blocks] = '\0';
      sVar25 = literal_split->num_blocks;
      literal_split->lengths[sVar25] = (uint32_t)pHVar32;
      literal_split->num_blocks = sVar25 + 1;
    }
    else {
      pvVar44 = BrotliAllocate(m,uVar46 * 0x410);
      uVar7 = uVar46;
      pvVar6 = pvVar44;
      do {
        memset(pvVar6,0,0x408);
        *(undefined8 *)((long)pvVar6 + 0x408) = 0x7ff0000000000000;
        pvVar6 = (void *)((long)pvVar6 + 0x410);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar36 = 0;
      uVar7 = 7;
      do {
        puVar9 = (undefined1 *)((uVar36 * (long)pHVar32) / uVar46);
        if (uVar36 != 0) {
          uVar7 = (ulong)(uint)((int)uVar7 * 0x41a7);
          puVar9 = puVar9 + uVar7 % ((ulong)pHVar32 / uVar46);
        }
        if (pHVar32 <= (HistogramPair *)(puVar9 + 0x46)) {
          puVar9 = (undefined1 *)((long)&pHVar32[-3].idx1 + 1);
        }
        plVar2 = (long *)((long)pvVar44 + uVar36 * 0x410 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        lVar43 = -0x46;
        do {
          piVar1 = (int *)((long)pvVar44 +
                          (ulong)(byte)(puVar9 + (long)local_fe0)[lVar43 + 0x46] * 4 +
                          uVar36 * 0x410);
          *piVar1 = *piVar1 + 1;
          lVar43 = lVar43 + 1;
        } while (lVar43 != 0);
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar46);
      uVar7 = (ulong)((long)pHVar32 * 2) / 0x46 + uVar46 + 99;
      if (uVar7 != uVar7 % uVar46) {
        uVar11 = 7;
        uVar36 = 0;
        do {
          memset(local_b40,0,0x408);
          local_738 = INFINITY;
          uVar11 = (ulong)(uint)((int)uVar11 * 0x41a7);
          pbVar29 = (byte *)(uVar11 % (ulong)((long)&pHVar32[-3].idx1 + 3U) + (long)local_fe0);
          local_b40._1024_8_ = 0x46;
          lVar43 = -0x46;
          do {
            bVar33 = *pbVar29;
            pbVar29 = pbVar29 + 1;
            *(int *)(local_b40 + (ulong)bVar33 * 4) = *(int *)(local_b40 + (ulong)bVar33 * 4) + 1;
            lVar43 = lVar43 + 1;
          } while (lVar43 != 0);
          lVar43 = (uVar36 % uVar46) * 0x410;
          plVar2 = (long *)((long)pvVar44 + lVar43 + 0x400);
          *plVar2 = *plVar2 + 0x46;
          lVar26 = 0;
          do {
            piVar1 = (int *)((long)pvVar44 + lVar26 * 4 + lVar43);
            *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
            lVar26 = lVar26 + 1;
          } while (lVar26 != 0x100);
          uVar36 = uVar36 + 1;
        } while (uVar36 < uVar7 - uVar7 % uVar46);
      }
      pBVar42 = (BrotliEncoderParams *)m;
      pvVar6 = BrotliAllocate(m,(size_t)pHVar32);
      pvVar10 = BrotliAllocate(m,uVar46 << 0xb);
      pvVar13 = BrotliAllocate(m,uVar46 * 8);
      sVar25 = (uVar46 + 7 >> 3) * (long)pHVar32;
      if (sVar25 == 0) {
        local_fb8 = (void *)0x0;
      }
      else {
        local_fb8 = BrotliAllocate(m,sVar25);
      }
      pvVar14 = BrotliAllocate(m,uVar46 * 2);
      lVar43 = 3;
      if (10 < params->quality) {
        lVar43 = 10;
      }
      pHVar38 = (HistogramPair *)((long)&pHVar32[-1].cost_diff + 7);
      lVar26 = 0;
      do {
        if (uVar46 < 2) {
          memset(pvVar6,0,(size_t)pHVar32);
LAB_00117677:
          pBVar37 = (BlockSplit *)0x1;
        }
        else {
          uVar7 = uVar46 + 7 >> 3;
          memset(pvVar10,0,uVar46 << 0xb);
          uVar36 = 0;
          puVar30 = (uint *)((long)pvVar44 + 0x400);
          do {
            uVar11 = (ulong)*puVar30;
            if (uVar11 < 0x100) {
              dVar49 = kLog2Table[uVar11];
            }
            else {
              dVar49 = log2((double)uVar11);
            }
            *(double *)((long)pvVar10 + uVar36 * 8) = dVar49;
            uVar36 = uVar36 + 1;
            puVar30 = puVar30 + 0x104;
          } while (uVar46 != uVar36);
          pvVar16 = (void *)(uVar46 * 0x7f8 + (long)pvVar10);
          lVar45 = 0x100;
          puVar30 = (uint *)((long)pvVar44 + 0x3fc);
          do {
            lVar45 = lVar45 + -1;
            uVar36 = 0;
            puVar41 = puVar30;
            do {
              dVar49 = *(double *)((long)pvVar10 + uVar36 * 8);
              uVar11 = (ulong)*puVar41;
              dVar48 = -2.0;
              if (uVar11 != 0) {
                if (*puVar41 < 0x100) {
                  dVar48 = kLog2Table[uVar11];
                }
                else {
                  dVar48 = log2((double)uVar11);
                }
              }
              *(double *)((long)pvVar16 + uVar36 * 8) = dVar49 - dVar48;
              uVar36 = uVar36 + 1;
              puVar41 = puVar41 + 0x104;
            } while (uVar46 != uVar36);
            pvVar16 = (void *)((long)pvVar16 + uVar46 * -8);
            puVar30 = puVar30 + -1;
          } while (lVar45 != 0);
          memset(pvVar13,0,uVar46 * 8);
          memset(local_fb8,0,uVar7 * (long)pHVar32);
          pHVar15 = (HistogramPair *)0x0;
          do {
            bVar33 = *(byte *)((long)local_fe0 + (long)pHVar15);
            uVar36 = 0;
            dVar49 = 1e+99;
            do {
              dVar48 = *(double *)((long)pvVar10 + uVar36 * 8 + bVar33 * uVar46 * 8) +
                       *(double *)((long)pvVar13 + uVar36 * 8);
              *(double *)((long)pvVar13 + uVar36 * 8) = dVar48;
              if (dVar48 < dVar49) {
                *(char *)((long)pvVar6 + (long)pHVar15) = (char)uVar36;
                dVar49 = dVar48;
              }
              uVar36 = uVar36 + 1;
            } while (uVar46 != uVar36);
            dVar48 = 28.1;
            if (pHVar15 < (HistogramPair *)0x7d0) {
              dVar48 = (((double)(long)pHVar15 * 0.07) / 2000.0 + 0.77) * 28.1;
            }
            uVar36 = 0;
            do {
              dVar50 = *(double *)((long)pvVar13 + uVar36 * 8) - dVar49;
              *(double *)((long)pvVar13 + uVar36 * 8) = dVar50;
              if (dVar48 <= dVar50) {
                *(double *)((long)pvVar13 + uVar36 * 8) = dVar48;
                pbVar29 = (byte *)((long)local_fb8 + (uVar36 >> 3) + (long)pHVar15 * uVar7);
                *pbVar29 = *pbVar29 | '\x01' << ((byte)uVar36 & 7);
              }
              uVar36 = uVar36 + 1;
            } while (uVar46 != uVar36);
            pHVar15 = (HistogramPair *)((long)&pHVar15->idx1 + 1);
          } while (pHVar15 != pHVar32);
          if (pHVar38 == (HistogramPair *)0x0) goto LAB_00117677;
          bVar33 = *(byte *)((long)pvVar6 + (long)pHVar38);
          pvVar16 = (void *)((long)((long)&pHVar32[-1].cost_diff + 6) * uVar7 + (long)local_fb8);
          pBVar37 = (BlockSplit *)0x1;
          pHVar15 = pHVar32;
          do {
            if ((*(byte *)((long)pvVar16 + (ulong)(bVar33 >> 3)) >> (bVar33 & 7) & 1) != 0) {
              bVar35 = *(byte *)((long)pvVar6 + -2 + (long)pHVar15);
              pBVar37 = (BlockSplit *)((long)&pBVar37->num_types + (ulong)(bVar33 != bVar35));
              bVar33 = bVar35;
            }
            *(byte *)((long)pvVar6 + -2 + (long)pHVar15) = bVar33;
            pvVar16 = (void *)((long)pvVar16 - uVar7);
            pHVar15 = (HistogramPair *)((long)&pHVar15[-1].cost_diff + 7);
          } while (pHVar15 != (HistogramPair *)0x1);
        }
        if (uVar46 != 0) {
          uVar7 = 0;
          do {
            *(undefined2 *)((long)pvVar14 + uVar7 * 2) = 0x100;
            uVar7 = uVar7 + 1;
          } while (uVar46 != uVar7);
        }
        pHVar15 = (HistogramPair *)0x0;
        uVar4 = 0;
        do {
          if (*(short *)((long)pvVar14 + (ulong)*(byte *)((long)pvVar6 + (long)pHVar15) * 2) ==
              0x100) {
            *(ushort *)((long)pvVar14 + (ulong)*(byte *)((long)pvVar6 + (long)pHVar15) * 2) = uVar4;
            uVar4 = uVar4 + 1;
          }
          pHVar15 = (HistogramPair *)((long)&pHVar15->idx1 + 1);
        } while (pHVar32 != pHVar15);
        pHVar15 = (HistogramPair *)0x0;
        do {
          *(undefined1 *)((long)pvVar6 + (long)pHVar15) =
               *(undefined1 *)((long)pvVar14 + (ulong)*(byte *)((long)pvVar6 + (long)pHVar15) * 2);
          pHVar15 = (HistogramPair *)((long)&pHVar15->idx1 + 1);
        } while (pHVar32 != pHVar15);
        uVar46 = (ulong)uVar4;
        if (uVar4 != 0) {
          lVar45 = 0;
          do {
            memset((void *)((long)pvVar44 + lVar45),0,0x408);
            *(undefined8 *)((long)pvVar44 + lVar45 + 0x408) = 0x7ff0000000000000;
            lVar45 = lVar45 + 0x410;
          } while (uVar46 * 0x410 - lVar45 != 0);
        }
        pHVar15 = (HistogramPair *)0x0;
        do {
          lVar45 = (ulong)*(byte *)((long)pvVar6 + (long)pHVar15) * 0x410;
          piVar1 = (int *)((long)pvVar44 +
                          (ulong)*(byte *)((long)local_fe0 + (long)pHVar15) * 4 + lVar45);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar44 + lVar45 + 0x400);
          *plVar2 = *plVar2 + 1;
          pHVar15 = (HistogramPair *)((long)&pHVar15->idx1 + 1);
        } while (pHVar32 != pHVar15);
        lVar26 = lVar26 + 1;
      } while (lVar26 != lVar43);
      pBVar51 = pBVar42;
      BrotliFree((MemoryManager *)pBVar42,pvVar10);
      BrotliFree((MemoryManager *)pBVar42,pvVar13);
      BrotliFree((MemoryManager *)pBVar42,local_fb8);
      BrotliFree((MemoryManager *)pBVar42,pvVar14);
      BrotliFree((MemoryManager *)pBVar42,pvVar44);
      if (pBVar37 == (BlockSplit *)0x0) {
        local_f88 = (HistogramPair *)0x0;
      }
      else {
        local_f88 = (HistogramPair *)BrotliAllocate((MemoryManager *)pBVar42,(long)pBVar37 * 4);
      }
      if (pBVar37 == (BlockSplit *)0x0) {
        pvVar44 = (void *)0x0;
      }
      else {
        pvVar44 = BrotliAllocate((MemoryManager *)pBVar42,(long)pBVar37 * 4);
      }
      uVar7 = (long)pBVar37 * 0x10 + 0x3f0;
      uVar46 = uVar7 >> 6;
      if (uVar7 < 0x40) {
        local_fa0 = (HistogramLiteral *)0x0;
        puVar22 = (uint32_t *)0x0;
      }
      else {
        local_fa0 = (HistogramLiteral *)BrotliAllocate((MemoryManager *)pBVar42,uVar46 * 0x410);
        puVar22 = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar42,uVar46 * 4);
      }
      pBVar42 = pBVar51;
      pBVar19 = pBVar37;
      if (pBVar37 == (BlockSplit *)0x0) {
        local_fe8 = (HistogramCommand *)0x0;
      }
      else {
        pBVar17 = (BlockSplit *)0x40;
        if (pBVar37 < (BlockSplit *)0x40) {
          pBVar17 = pBVar37;
        }
        local_fe8 = (HistogramCommand *)
                    BrotliAllocate((MemoryManager *)pBVar51,(long)pBVar17 * 0x410);
      }
      local_f58 = (HistogramPair *)BrotliAllocate((MemoryManager *)pBVar51,0xc018);
      lVar43 = 0;
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar44,0,(long)pBVar37 * 4);
      pHVar15 = (HistogramPair *)0x0;
      do {
        piVar1 = (int *)((long)pvVar44 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if ((pHVar38 == pHVar15) ||
           (*(char *)((long)pvVar6 + (long)pHVar15) !=
            *(char *)((long)pvVar6 + (long)((long)&pHVar15->idx1 + 1)))) {
          lVar43 = lVar43 + 1;
        }
        pHVar15 = (HistogramPair *)((long)&pHVar15->idx1 + 1);
      } while (pHVar32 != pHVar15);
      in_stack_fffffffffffff000 = pBVar19;
      if (pBVar19 == (BlockSplit *)0x0) {
        uVar7 = 0;
      }
      else {
        local_fc0 = (void *)0x0;
        local_fb8 = (void *)0x0;
        local_fc8 = 0;
        uVar7 = 0;
        local_ff0 = 0;
        pHVar32 = local_f88;
        local_f90 = uVar46;
        do {
          pBVar37 = (BlockSplit *)0x40;
          if (pBVar19 < (BlockSplit *)0x40) {
            pBVar37 = pBVar19;
          }
          lVar43 = (long)&pBVar37->num_types + (ulong)(pBVar37 == (BlockSplit *)0x0);
          lVar26 = 0;
          do {
            pHVar18 = (HistogramLiteral *)((long)local_fe8 + lVar26 * 0x410);
            memset(pHVar18,0,0x408);
            ((HistogramLiteral *)((long)local_fe8 + lVar26 * 0x410))->bit_cost_ = INFINITY;
            if (*(int *)((long)pvVar44 + (local_fc8 + lVar26) * 4) != 0) {
              sVar25 = pHVar18->total_count_;
              uVar36 = 0;
              do {
                pHVar18->data_[*(byte *)((long)local_fe0 + uVar36 + local_ff0)] =
                     pHVar18->data_[*(byte *)((long)local_fe0 + uVar36 + local_ff0)] + 1;
                pHVar18->total_count_ = sVar25 + 1 + uVar36;
                uVar36 = uVar36 + 1;
              } while (uVar36 < *(uint *)((long)pvVar44 + (local_fc8 + lVar26) * 4));
              local_ff0 = local_ff0 + uVar36;
            }
            dVar49 = BrotliPopulationCostLiteral(pHVar18);
            pHVar18->bit_cost_ = dVar49;
            new_clusters[lVar26] = (uint32_t)lVar26;
            symbols[lVar26] = (uint32_t)lVar26;
            sizes[lVar26] = 1;
            lVar26 = lVar26 + 1;
          } while (lVar26 != lVar43);
          sVar25 = (long)in_stack_fffffffffffff000 - local_fc8;
          if (0x3f < sVar25) {
            sVar25 = 0x40;
          }
          sVar25 = BrotliHistogramCombineLiteral
                             ((HistogramLiteral *)local_fe8,sizes,symbols,new_clusters,local_f58,
                              sVar25,sVar25,0x40,0x800);
          uVar36 = (long)local_fc0 + sVar25;
          if (local_f90 < uVar36) {
            uVar11 = local_f90;
            if (local_f90 == 0) {
              uVar11 = uVar36;
            }
            do {
              uVar27 = uVar11;
              uVar11 = uVar27 * 2;
            } while (uVar27 < uVar36);
            pBVar51 = pBVar42;
            if (uVar27 == 0) {
              pHVar18 = (HistogramLiteral *)0x0;
            }
            else {
              pHVar18 = (HistogramLiteral *)BrotliAllocate((MemoryManager *)pBVar42,uVar27 * 0x410);
            }
            if (local_f90 != 0) {
              memcpy(pHVar18,local_fa0,local_f90 * 0x410);
            }
            BrotliFree((MemoryManager *)pBVar42,local_fa0);
            local_fa0 = pHVar18;
            local_f90 = uVar27;
            pBVar42 = pBVar51;
          }
          uVar36 = (long)local_fb8 + sVar25;
          if (uVar46 < uVar36) {
            uVar11 = uVar46;
            if (uVar46 == 0) {
              uVar11 = uVar36;
            }
            do {
              uVar27 = uVar11;
              uVar11 = uVar27 * 2;
            } while (uVar27 < uVar36);
            if (uVar27 == 0) {
              puVar21 = (uint32_t *)0x0;
            }
            else {
              puVar21 = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar42,uVar27 * 4);
            }
            if (uVar46 != 0) {
              memcpy(puVar21,puVar22,uVar46 << 2);
            }
            BrotliFree((MemoryManager *)pBVar42,puVar22);
            uVar46 = uVar27;
            puVar22 = puVar21;
          }
          if (sVar25 != 0) {
            pHVar18 = local_fa0 + (long)local_fc0;
            sVar47 = 0;
            do {
              uVar40 = new_clusters[sVar47];
              memcpy(pHVar18,(HistogramLiteral *)((long)local_fe8 + (ulong)uVar40 * 0x410),0x410);
              puVar22[(long)local_fb8 + sVar47] = sizes[uVar40];
              remap[new_clusters[sVar47]] = (uint32_t)sVar47;
              sVar47 = sVar47 + 1;
              pHVar18 = pHVar18 + 1;
            } while (sVar25 != sVar47);
            local_fc0 = (void *)((long)local_fc0 + sVar47);
            local_fb8 = (void *)((long)local_fb8 + sVar47);
          }
          lVar26 = 0;
          do {
            *(uint32_t *)((long)pHVar32 + lVar26 * 4) = remap[symbols[lVar26]] + (int)uVar7;
            lVar26 = lVar26 + 1;
          } while (lVar43 != lVar26);
          uVar7 = uVar7 + sVar25;
          local_fc8 = local_fc8 + 0x40;
          pBVar19 = (BlockSplit *)&pBVar19[-2].types_alloc_size;
          pHVar32 = (HistogramPair *)((long)pHVar32 + 0x100);
        } while (local_fc8 < in_stack_fffffffffffff000);
      }
      pBVar51 = pBVar42;
      BrotliFree((MemoryManager *)pBVar42,local_fe8);
      uVar46 = (uVar7 >> 1) * uVar7;
      if (uVar7 << 6 < uVar46) {
        uVar46 = uVar7 << 6;
      }
      if (0x800 < uVar46) {
        BrotliFree((MemoryManager *)pBVar42,local_f58);
        local_f58 = (HistogramPair *)BrotliAllocate((MemoryManager *)pBVar42,uVar46 * 0x18 + 0x18);
      }
      if (uVar7 == 0) {
        puVar21 = (uint32_t *)0x0;
      }
      else {
        puVar21 = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar51,uVar7 * 4);
        uVar36 = 0;
        do {
          puVar21[uVar36] = (uint32_t)uVar36;
          uVar36 = uVar36 + 1;
        } while (uVar7 != uVar36);
      }
      pHVar38 = local_f58;
      sVar25 = BrotliHistogramCombineLiteral
                         (local_fa0,puVar22,&local_f88->idx1,puVar21,local_f58,uVar7,
                          (size_t)in_stack_fffffffffffff000,0x100,uVar46);
      pBVar42 = pBVar51;
      BrotliFree((MemoryManager *)pBVar51,local_f58);
      BrotliFree((MemoryManager *)pBVar51,puVar22);
      if (uVar7 == 0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = BrotliAllocate((MemoryManager *)pBVar51,uVar7 * 4);
        memset(pvVar10,0xff,uVar7 << 2);
      }
      if (in_stack_fffffffffffff000 != (BlockSplit *)0x0) {
        iVar24 = 0;
        pBVar37 = (BlockSplit *)0x0;
        local_ff0 = 0;
        do {
          memset(local_b40,0,0x408);
          local_738 = INFINITY;
          if (*(int *)((long)pvVar44 + (long)pBVar37 * 4) != 0) {
            uVar46 = 0;
            do {
              *(int *)(local_b40 + (ulong)*(byte *)((long)local_fe0 + uVar46 + local_ff0) * 4) =
                   *(int *)(local_b40 + (ulong)*(byte *)((long)local_fe0 + uVar46 + local_ff0) * 4)
                   + 1;
              uVar46 = uVar46 + 1;
            } while (uVar46 < *(uint *)((long)pvVar44 + (long)pBVar37 * 4));
            local_ff0 = local_ff0 + uVar46;
            local_b40._1024_8_ = uVar46;
          }
          puVar9 = (undefined1 *)0x0;
          if (pBVar37 != (BlockSplit *)0x0) {
            puVar9 = (undefined1 *)((long)&pBVar37[-1].lengths_alloc_size + 7);
          }
          uVar40 = *(uint *)((long)local_f88 + puVar9 * 4);
          uVar46 = (ulong)uVar40;
          local_fe8 = (HistogramCommand *)
                      BrotliHistogramBitCostDistanceLiteral
                                ((HistogramLiteral *)local_b40,local_fa0 + uVar46);
          if (sVar25 != 0) {
            sVar47 = 0;
            do {
              dVar49 = BrotliHistogramBitCostDistanceLiteral
                                 ((HistogramLiteral *)local_b40,local_fa0 + puVar21[sVar47]);
              if (dVar49 < (double)local_fe8) {
                uVar46 = (ulong)puVar21[sVar47];
                local_fe8 = (HistogramCommand *)dVar49;
              }
              uVar40 = (uint)uVar46;
              sVar47 = sVar47 + 1;
            } while (sVar25 != sVar47);
          }
          *(uint *)((long)local_f88 + pBVar37 * 4) = uVar40;
          if (*(int *)((long)pvVar10 + (ulong)uVar40 * 4) == -1) {
            *(int *)((long)pvVar10 + (ulong)uVar40 * 4) = iVar24;
            iVar24 = iVar24 + 1;
          }
          pBVar37 = (BlockSplit *)((long)&pBVar37->num_types + 1);
        } while (pBVar37 != in_stack_fffffffffffff000);
      }
      m = (MemoryManager *)pBVar42;
      BrotliFree((MemoryManager *)pBVar42,puVar21);
      BrotliFree((MemoryManager *)pBVar42,local_fa0);
      pBVar37 = (BlockSplit *)literal_split->types_alloc_size;
      if (pBVar37 < in_stack_fffffffffffff000) {
        if (pBVar37 == (BlockSplit *)0x0) {
          pBVar37 = in_stack_fffffffffffff000;
        }
        do {
          pBVar19 = pBVar37;
          pBVar37 = (BlockSplit *)((long)pBVar19 * 2);
        } while (pBVar19 < in_stack_fffffffffffff000);
        if (pBVar19 == (BlockSplit *)0x0) {
          puVar8 = (uint8_t *)0x0;
        }
        else {
          puVar8 = (uint8_t *)BrotliAllocate((MemoryManager *)pBVar42,(size_t)pBVar19);
        }
        if (literal_split->types_alloc_size != 0) {
          memcpy(puVar8,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar8;
        literal_split->types_alloc_size = (size_t)pBVar19;
      }
      pBVar37 = (BlockSplit *)literal_split->lengths_alloc_size;
      if (pBVar37 < in_stack_fffffffffffff000) {
        if (pBVar37 == (BlockSplit *)0x0) {
          pBVar37 = in_stack_fffffffffffff000;
        }
        do {
          pBVar19 = pBVar37;
          pBVar37 = (BlockSplit *)((long)pBVar19 * 2);
        } while (pBVar19 < in_stack_fffffffffffff000);
        if (pBVar19 == (BlockSplit *)0x0) {
          puVar22 = (uint32_t *)0x0;
        }
        else {
          puVar22 = (uint32_t *)BrotliAllocate(m,(long)pBVar19 * 4);
        }
        if (literal_split->lengths_alloc_size != 0) {
          memcpy(puVar22,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar22;
        literal_split->lengths_alloc_size = (size_t)pBVar19;
      }
      uVar28 = 0;
      if (in_stack_fffffffffffff000 == (BlockSplit *)0x0) {
        sVar47 = 1;
        sVar25 = 0;
      }
      else {
        uVar40 = 0;
        sVar25 = 0;
        pBVar37 = (BlockSplit *)0x0;
        do {
          uVar28 = uVar28 + *(int *)((long)pvVar44 + (long)pBVar37 * 4);
          if (((BlockSplit *)((long)&in_stack_fffffffffffff000[-1].lengths_alloc_size + 7) ==
               pBVar37) ||
             (uVar3 = *(uint *)((long)local_f88 + pBVar37 * 4),
             *(uint *)((long)local_f88 + pBVar37 * 4) !=
             *(uint *)((long)local_f88 + (undefined1 *)((long)&pBVar37->num_types + 1) * 4))) {
            uVar34 = uVar40 & 0xff;
            uVar3 = *(uint *)((long)pvVar10 + (ulong)*(uint *)((long)local_f88 + pBVar37 * 4) * 4);
            bVar35 = (byte)uVar3;
            literal_split->types[sVar25] = bVar35;
            bVar33 = (byte)uVar40;
            uVar40 = uVar3;
            if (bVar35 < bVar33) {
              uVar40 = uVar34;
            }
            literal_split->lengths[sVar25] = uVar28;
            sVar25 = sVar25 + 1;
            uVar28 = 0;
            uVar3 = uVar40;
          }
          pHVar38 = (HistogramPair *)(ulong)uVar3;
          pBVar37 = (BlockSplit *)((long)&pBVar37->num_types + 1);
        } while (in_stack_fffffffffffff000 != pBVar37);
        sVar47 = (ulong)(uVar40 & 0xff) + 1;
      }
      literal_split->num_blocks = sVar25;
      literal_split->num_types = sVar47;
      pBVar42 = (BrotliEncoderParams *)m;
      BrotliFree(m,pvVar10);
      BrotliFree(m,pvVar44);
      BrotliFree(m,local_f88);
      BrotliFree(m,pvVar6);
    }
  }
  else {
    BrotliSplitBlockLiteralsFromStored
              (m,cmds,num_commands,pos,(size_t)pHVar38,literal_split,literals_block_splits_decoder,
               current_block_literals);
  }
  BrotliFree(m,local_fe0);
  if (num_commands == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = BrotliAllocate(m,num_commands * 2);
    puVar23 = &cmds->cmd_prefix_;
    sVar25 = 0;
    do {
      *(uint16_t *)((long)pvVar6 + sVar25 * 2) = *puVar23;
      sVar25 = sVar25 + 1;
      puVar23 = puVar23 + 8;
    } while (num_commands != sVar25);
  }
  pBVar51 = pBVar42;
  if (cmds_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    uVar46 = 0x32;
    if (num_commands < 0x6784) {
      uVar46 = num_commands / 0x212 + 1;
    }
    if (num_commands == 0) {
      insert_and_copy_split->num_types = 1;
    }
    else if (num_commands < 0x80) {
      uVar46 = insert_and_copy_split->types_alloc_size;
      uVar7 = insert_and_copy_split->num_blocks + 1;
      if (uVar46 < uVar7) {
        if (uVar46 == 0) {
          uVar46 = uVar7;
        }
        do {
          uVar36 = uVar46;
          uVar46 = uVar36 * 2;
        } while (uVar36 < uVar7);
        if (uVar36 == 0) {
          puVar8 = (uint8_t *)0x0;
        }
        else {
          puVar8 = (uint8_t *)BrotliAllocate((MemoryManager *)pBVar42,uVar36);
        }
        if (insert_and_copy_split->types_alloc_size != 0) {
          memcpy(puVar8,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree((MemoryManager *)pBVar42,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar8;
        insert_and_copy_split->types_alloc_size = uVar36;
      }
      uVar46 = insert_and_copy_split->lengths_alloc_size;
      uVar7 = insert_and_copy_split->num_blocks + 1;
      if (uVar46 < uVar7) {
        if (uVar46 == 0) {
          uVar46 = uVar7;
        }
        do {
          uVar36 = uVar46;
          uVar46 = uVar36 * 2;
        } while (uVar36 < uVar7);
        if (uVar36 == 0) {
          puVar22 = (uint32_t *)0x0;
        }
        else {
          puVar22 = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar42,uVar36 * 4);
        }
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          memcpy(puVar22,insert_and_copy_split->lengths,
                 insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree((MemoryManager *)pBVar42,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar22;
        insert_and_copy_split->lengths_alloc_size = uVar36;
      }
      insert_and_copy_split->num_types = 1;
      insert_and_copy_split->types[insert_and_copy_split->num_blocks] = '\0';
      sVar25 = insert_and_copy_split->num_blocks;
      insert_and_copy_split->lengths[sVar25] = (uint32_t)num_commands;
      insert_and_copy_split->num_blocks = sVar25 + 1;
      pBVar51 = pBVar42;
    }
    else {
      pvVar10 = BrotliAllocate((MemoryManager *)pBVar42,uVar46 * 0xb10);
      uVar7 = uVar46;
      pvVar44 = pvVar10;
      do {
        memset(pvVar44,0,0xb08);
        *(undefined8 *)((long)pvVar44 + 0xb08) = 0x7ff0000000000000;
        pvVar44 = (void *)((long)pvVar44 + 0xb10);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar36 = 0;
      uVar7 = 7;
      do {
        uVar11 = (uVar36 * num_commands) / uVar46;
        if (uVar36 != 0) {
          uVar7 = (ulong)(uint)((int)uVar7 * 0x41a7);
          uVar11 = uVar11 + uVar7 % (num_commands / uVar46);
        }
        if (num_commands <= uVar11 + 0x28) {
          uVar11 = num_commands - 0x29;
        }
        plVar2 = (long *)((long)pvVar10 + uVar36 * 0xb10 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        lVar43 = 0;
        do {
          piVar1 = (int *)((long)pvVar10 +
                          (ulong)*(ushort *)((long)pvVar6 + lVar43 * 2 + uVar11 * 2) * 4 +
                          uVar36 * 0xb10);
          *piVar1 = *piVar1 + 1;
          lVar43 = lVar43 + 1;
        } while (lVar43 != 0x28);
        uVar36 = uVar36 + 1;
      } while (uVar36 != uVar46);
      uVar7 = (num_commands * 2) / 0x28 + uVar46 + 99;
      if (uVar7 != uVar7 % uVar46) {
        uVar11 = 7;
        uVar36 = 0;
        do {
          memset(local_b40,0,0xb08);
          local_38 = INFINITY;
          uVar11 = (ulong)(uint)((int)uVar11 * 0x41a7);
          puVar12 = (ushort *)((long)pvVar6 + (uVar11 % (num_commands - 0x27)) * 2);
          local_40 = 0x28;
          lVar43 = -0x28;
          do {
            uVar4 = *puVar12;
            puVar12 = puVar12 + 1;
            *(int *)(local_b40 + (ulong)uVar4 * 4) = *(int *)(local_b40 + (ulong)uVar4 * 4) + 1;
            lVar43 = lVar43 + 1;
          } while (lVar43 != 0);
          lVar43 = (uVar36 % uVar46) * 0xb10;
          plVar2 = (long *)((long)pvVar10 + lVar43 + 0xb00);
          *plVar2 = *plVar2 + 0x28;
          lVar26 = 0;
          do {
            piVar1 = (int *)((long)pvVar10 + lVar26 * 4 + lVar43);
            *piVar1 = *piVar1 + *(int *)(local_b40 + lVar26 * 4);
            lVar26 = lVar26 + 1;
          } while (lVar26 != 0x2c0);
          uVar36 = uVar36 + 1;
        } while (uVar36 < uVar7 - uVar7 % uVar46);
      }
      pBVar51 = pBVar42;
      pvVar44 = BrotliAllocate((MemoryManager *)pBVar42,num_commands);
      pvVar13 = BrotliAllocate((MemoryManager *)pBVar42,uVar46 * 0x1600);
      pvVar14 = BrotliAllocate((MemoryManager *)pBVar42,uVar46 * 8);
      sVar25 = (uVar46 + 7 >> 3) * num_commands;
      if (sVar25 == 0) {
        local_fc0 = (void *)0x0;
      }
      else {
        local_fc0 = BrotliAllocate((MemoryManager *)pBVar42,sVar25);
      }
      pvVar16 = BrotliAllocate((MemoryManager *)pBVar42,uVar46 * 2);
      lVar43 = 3;
      if (10 < params->quality) {
        lVar43 = 10;
      }
      sVar25 = num_commands - 1;
      lVar26 = 0;
      do {
        if (uVar46 < 2) {
          memset(pvVar44,0,num_commands);
LAB_00117b22:
          pBVar37 = (BlockSplit *)0x1;
        }
        else {
          uVar36 = uVar46 + 7 >> 3;
          memset(pvVar13,0,uVar46 * 0x1600);
          uVar7 = 0;
          puVar30 = (uint *)((long)pvVar10 + 0xb00);
          do {
            uVar11 = (ulong)*puVar30;
            if (uVar11 < 0x100) {
              dVar49 = kLog2Table[uVar11];
            }
            else {
              dVar49 = log2((double)uVar11);
            }
            *(double *)((long)pvVar13 + uVar7 * 8) = dVar49;
            uVar7 = uVar7 + 1;
            puVar30 = puVar30 + 0x2c4;
          } while (uVar46 != uVar7);
          pvVar31 = (void *)(uVar46 * 0x15f8 + (long)pvVar13);
          lVar45 = 0x2c0;
          puVar30 = (uint *)((long)pvVar10 + 0xafc);
          do {
            lVar45 = lVar45 + -1;
            uVar7 = 0;
            puVar41 = puVar30;
            do {
              dVar49 = *(double *)((long)pvVar13 + uVar7 * 8);
              uVar11 = (ulong)*puVar41;
              dVar48 = -2.0;
              if (uVar11 != 0) {
                if (*puVar41 < 0x100) {
                  dVar48 = kLog2Table[uVar11];
                }
                else {
                  dVar48 = log2((double)uVar11);
                }
              }
              *(double *)((long)pvVar31 + uVar7 * 8) = dVar49 - dVar48;
              uVar7 = uVar7 + 1;
              puVar41 = puVar41 + 0x2c4;
            } while (uVar46 != uVar7);
            pvVar31 = (void *)((long)pvVar31 + uVar46 * -8);
            puVar30 = puVar30 + -1;
          } while (lVar45 != 0);
          memset(pvVar14,0,uVar46 * 8);
          memset(local_fc0,0,uVar36 * num_commands);
          uVar7 = 0;
          do {
            uVar4 = *(ushort *)((long)pvVar6 + uVar7 * 2);
            uVar11 = 0;
            dVar49 = 1e+99;
            do {
              dVar48 = *(double *)((long)pvVar13 + uVar11 * 8 + uVar4 * uVar46 * 8) +
                       *(double *)((long)pvVar14 + uVar11 * 8);
              *(double *)((long)pvVar14 + uVar11 * 8) = dVar48;
              if (dVar48 < dVar49) {
                *(char *)((long)pvVar44 + uVar7) = (char)uVar11;
                dVar49 = dVar48;
              }
              uVar11 = uVar11 + 1;
            } while (uVar46 != uVar11);
            dVar48 = 13.5;
            if (uVar7 < 2000) {
              dVar48 = (((double)(long)uVar7 * 0.07) / 2000.0 + 0.77) * 13.5;
            }
            uVar11 = 0;
            do {
              dVar50 = *(double *)((long)pvVar14 + uVar11 * 8) - dVar49;
              *(double *)((long)pvVar14 + uVar11 * 8) = dVar50;
              if (dVar48 <= dVar50) {
                *(double *)((long)pvVar14 + uVar11 * 8) = dVar48;
                pbVar29 = (byte *)((long)local_fc0 + (uVar11 >> 3) + uVar7 * uVar36);
                *pbVar29 = *pbVar29 | '\x01' << ((byte)uVar11 & 7);
              }
              uVar11 = uVar11 + 1;
            } while (uVar46 != uVar11);
            uVar7 = uVar7 + 1;
          } while (uVar7 != num_commands);
          if (sVar25 == 0) goto LAB_00117b22;
          bVar33 = *(byte *)((long)pvVar44 + sVar25);
          pvVar31 = (void *)((num_commands - 2) * uVar36 + (long)local_fc0);
          pBVar37 = (BlockSplit *)0x1;
          sVar47 = num_commands;
          do {
            if ((*(byte *)((long)pvVar31 + (ulong)(bVar33 >> 3)) >> (bVar33 & 7) & 1) != 0) {
              bVar35 = *(byte *)((long)pvVar44 + (sVar47 - 2));
              pBVar37 = (BlockSplit *)((long)&pBVar37->num_types + (ulong)(bVar33 != bVar35));
              bVar33 = bVar35;
            }
            *(byte *)((long)pvVar44 + (sVar47 - 2)) = bVar33;
            pvVar31 = (void *)((long)pvVar31 - uVar36);
            sVar47 = sVar47 - 1;
          } while (sVar47 != 1);
        }
        if (uVar46 != 0) {
          uVar7 = 0;
          do {
            *(undefined2 *)((long)pvVar16 + uVar7 * 2) = 0x100;
            uVar7 = uVar7 + 1;
          } while (uVar46 != uVar7);
        }
        sVar47 = 0;
        uVar4 = 0;
        do {
          if (*(short *)((long)pvVar16 + (ulong)*(byte *)((long)pvVar44 + sVar47) * 2) == 0x100) {
            *(ushort *)((long)pvVar16 + (ulong)*(byte *)((long)pvVar44 + sVar47) * 2) = uVar4;
            uVar4 = uVar4 + 1;
          }
          sVar47 = sVar47 + 1;
        } while (num_commands != sVar47);
        sVar47 = 0;
        do {
          *(undefined1 *)((long)pvVar44 + sVar47) =
               *(undefined1 *)((long)pvVar16 + (ulong)*(byte *)((long)pvVar44 + sVar47) * 2);
          sVar47 = sVar47 + 1;
        } while (num_commands != sVar47);
        uVar46 = (ulong)uVar4;
        if (uVar4 != 0) {
          lVar45 = 0;
          do {
            memset((void *)((long)pvVar10 + lVar45),0,0xb08);
            *(undefined8 *)((long)pvVar10 + lVar45 + 0xb08) = 0x7ff0000000000000;
            lVar45 = lVar45 + 0xb10;
          } while (uVar46 * 0xb10 - lVar45 != 0);
        }
        sVar47 = 0;
        do {
          lVar45 = (ulong)*(byte *)((long)pvVar44 + sVar47) * 0xb10;
          piVar1 = (int *)((long)pvVar10 +
                          (ulong)*(ushort *)((long)pvVar6 + sVar47 * 2) * 4 + lVar45);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar10 + lVar45 + 0xb00);
          *plVar2 = *plVar2 + 1;
          sVar47 = sVar47 + 1;
        } while (num_commands != sVar47);
        lVar26 = lVar26 + 1;
      } while (lVar26 != lVar43);
      pBVar42 = pBVar51;
      BrotliFree((MemoryManager *)pBVar51,pvVar13);
      BrotliFree((MemoryManager *)pBVar51,pvVar14);
      BrotliFree((MemoryManager *)pBVar51,local_fc0);
      BrotliFree((MemoryManager *)pBVar51,pvVar16);
      BrotliFree((MemoryManager *)pBVar51,pvVar10);
      if (pBVar37 == (BlockSplit *)0x0) {
        local_fb0 = (uint32_t *)0x0;
      }
      else {
        local_fb0 = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar51,(long)pBVar37 * 4);
      }
      if (pBVar37 == (BlockSplit *)0x0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = BrotliAllocate((MemoryManager *)pBVar51,(long)pBVar37 * 4);
      }
      uVar7 = (long)pBVar37 * 0x10 + 0x3f0;
      uVar46 = uVar7 >> 6;
      if (uVar7 < 0x40) {
        out = (HistogramCommand *)0x0;
        puVar22 = (uint32_t *)0x0;
      }
      else {
        out = (HistogramCommand *)BrotliAllocate((MemoryManager *)pBVar51,uVar46 * 0xb10);
        puVar22 = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar42,uVar46 * 4);
      }
      pBVar51 = pBVar42;
      pBVar19 = pBVar37;
      if (pBVar37 == (BlockSplit *)0x0) {
        local_fe8 = (HistogramCommand *)0x0;
      }
      else {
        pBVar17 = (BlockSplit *)0x40;
        if (pBVar37 < (BlockSplit *)0x40) {
          pBVar17 = pBVar37;
        }
        local_fe8 = (HistogramCommand *)
                    BrotliAllocate((MemoryManager *)pBVar42,(long)pBVar17 * 0xb10);
      }
      local_f88 = (HistogramPair *)BrotliAllocate((MemoryManager *)pBVar42,0xc018);
      lVar43 = 0;
      memset(sizes,0,0x100);
      memset(new_clusters,0,0x100);
      memset(symbols,0,0x100);
      memset(remap,0,0x100);
      memset(pvVar10,0,(long)pBVar37 * 4);
      sVar47 = 0;
      do {
        piVar1 = (int *)((long)pvVar10 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if ((sVar25 == sVar47) ||
           (*(char *)((long)pvVar44 + sVar47) != *(char *)((long)pvVar44 + sVar47 + 1))) {
          lVar43 = lVar43 + 1;
        }
        sVar47 = sVar47 + 1;
      } while (num_commands != sVar47);
      in_stack_fffffffffffff000 = pBVar19;
      if (pBVar19 == (BlockSplit *)0x0) {
        local_fc0 = (void *)0x0;
      }
      else {
        local_fb8 = (void *)0x0;
        local_f90 = 0;
        local_fc8 = 0;
        local_fc0 = (void *)0x0;
        local_ff0 = 0;
        puVar21 = local_fb0;
        local_fa0 = (HistogramLiteral *)uVar46;
        do {
          pBVar37 = (BlockSplit *)0x40;
          if (pBVar19 < (BlockSplit *)0x40) {
            pBVar37 = pBVar19;
          }
          lVar43 = (long)&pBVar37->num_types + (ulong)(pBVar37 == (BlockSplit *)0x0);
          lVar26 = 0;
          do {
            pHVar20 = local_fe8 + lVar26;
            memset(pHVar20,0,0xb08);
            local_fe8[lVar26].bit_cost_ = INFINITY;
            if (*(int *)((long)pvVar10 + (local_fc8 + lVar26) * 4) != 0) {
              sVar25 = pHVar20->total_count_;
              uVar7 = 0;
              do {
                pHVar20->data_[*(ushort *)((long)pvVar6 + uVar7 * 2 + local_ff0 * 2)] =
                     pHVar20->data_[*(ushort *)((long)pvVar6 + uVar7 * 2 + local_ff0 * 2)] + 1;
                uVar7 = uVar7 + 1;
              } while (uVar7 < *(uint *)((long)pvVar10 + (local_fc8 + lVar26) * 4));
              pHVar20->total_count_ = sVar25 + uVar7;
              local_ff0 = local_ff0 + uVar7;
            }
            dVar49 = BrotliPopulationCostCommand(pHVar20);
            pHVar20->bit_cost_ = dVar49;
            new_clusters[lVar26] = (uint32_t)lVar26;
            symbols[lVar26] = (uint32_t)lVar26;
            sizes[lVar26] = 1;
            lVar26 = lVar26 + 1;
          } while (lVar26 != lVar43);
          sVar25 = (long)in_stack_fffffffffffff000 - local_fc8;
          if (0x3f < sVar25) {
            sVar25 = 0x40;
          }
          sVar25 = BrotliHistogramCombineCommand
                             (local_fe8,sizes,symbols,new_clusters,local_f88,sVar25,sVar25,0x40,
                              0x800);
          uVar7 = (long)local_fb8 + sVar25;
          if (local_fa0 < uVar7) {
            pHVar18 = local_fa0;
            if (local_fa0 == (HistogramLiteral *)0x0) {
              pHVar18 = (HistogramLiteral *)uVar7;
            }
            do {
              uVar36 = (ulong)pHVar18;
              pHVar18 = (HistogramLiteral *)(uVar36 * 2);
            } while (uVar36 < uVar7);
            if (uVar36 == 0) {
              pHVar20 = (HistogramCommand *)0x0;
            }
            else {
              pHVar20 = (HistogramCommand *)BrotliAllocate((MemoryManager *)pBVar51,uVar36 * 0xb10);
            }
            if (local_fa0 != (HistogramLiteral *)0x0) {
              memcpy(pHVar20,out,(long)local_fa0 * 0xb10);
            }
            BrotliFree((MemoryManager *)pBVar51,out);
            out = pHVar20;
            local_fa0 = (HistogramLiteral *)uVar36;
          }
          uVar7 = local_f90 + sVar25;
          if (uVar46 < uVar7) {
            uVar36 = uVar46;
            if (uVar46 == 0) {
              uVar36 = uVar7;
            }
            do {
              uVar11 = uVar36;
              uVar36 = uVar11 * 2;
            } while (uVar11 < uVar7);
            if (uVar11 == 0) {
              __dest = (uint32_t *)0x0;
            }
            else {
              __dest = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar51,uVar11 * 4);
            }
            if (uVar46 != 0) {
              memcpy(__dest,puVar22,uVar46 << 2);
            }
            BrotliFree((MemoryManager *)pBVar51,puVar22);
            uVar46 = uVar11;
            puVar22 = __dest;
          }
          if (sVar25 != 0) {
            pHVar20 = out + (long)local_fb8;
            sVar47 = 0;
            do {
              uVar40 = new_clusters[sVar47];
              memcpy(pHVar20,local_fe8 + uVar40,0xb10);
              puVar22[local_f90 + sVar47] = sizes[uVar40];
              remap[new_clusters[sVar47]] = (uint32_t)sVar47;
              sVar47 = sVar47 + 1;
              pHVar20 = pHVar20 + 1;
            } while (sVar25 != sVar47);
            local_fb8 = (void *)((long)local_fb8 + sVar47);
            local_f90 = local_f90 + sVar47;
          }
          lVar26 = 0;
          do {
            puVar21[lVar26] = remap[symbols[lVar26]] + (int)local_fc0;
            lVar26 = lVar26 + 1;
          } while (lVar43 != lVar26);
          local_fc0 = (void *)((long)local_fc0 + sVar25);
          local_fc8 = local_fc8 + 0x40;
          pBVar19 = (BlockSplit *)&pBVar19[-2].types_alloc_size;
          puVar21 = puVar21 + 0x40;
        } while (local_fc8 < in_stack_fffffffffffff000);
      }
      pBVar42 = pBVar51;
      BrotliFree((MemoryManager *)pBVar51,local_fe8);
      uVar46 = ((ulong)local_fc0 >> 1) * (long)local_fc0;
      if ((ulong)((long)local_fc0 << 6) < uVar46) {
        uVar46 = (long)local_fc0 << 6;
      }
      if (0x800 < uVar46) {
        BrotliFree((MemoryManager *)pBVar51,local_f88);
        local_f88 = (HistogramPair *)BrotliAllocate((MemoryManager *)pBVar51,uVar46 * 0x18 + 0x18);
      }
      if (local_fc0 == (void *)0x0) {
        puVar21 = (uint32_t *)0x0;
      }
      else {
        puVar21 = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar42,(long)local_fc0 * 4);
        uVar7 = 0;
        do {
          puVar21[uVar7] = (uint32_t)uVar7;
          uVar7 = uVar7 + 1;
        } while (local_fc0 != (void *)uVar7);
      }
      sVar25 = BrotliHistogramCombineCommand
                         (out,puVar22,local_fb0,puVar21,local_f88,(size_t)local_fc0,
                          (size_t)in_stack_fffffffffffff000,0x100,uVar46);
      pBVar51 = pBVar42;
      BrotliFree((MemoryManager *)pBVar42,local_f88);
      BrotliFree((MemoryManager *)pBVar42,puVar22);
      if (local_fc0 == (void *)0x0) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = BrotliAllocate((MemoryManager *)pBVar42,(long)local_fc0 * 4);
        memset(pvVar13,0xff,(long)local_fc0 << 2);
      }
      if (in_stack_fffffffffffff000 != (BlockSplit *)0x0) {
        iVar24 = 0;
        pBVar37 = (BlockSplit *)0x0;
        local_ff0 = 0;
        do {
          memset(local_b40,0,0xb08);
          local_38 = INFINITY;
          if (*(int *)((long)pvVar10 + (long)pBVar37 * 4) != 0) {
            uVar46 = 0;
            do {
              *(int *)(local_b40 + (ulong)*(ushort *)((long)pvVar6 + uVar46 * 2 + local_ff0 * 2) * 4
                      ) = *(int *)(local_b40 +
                                  (ulong)*(ushort *)((long)pvVar6 + uVar46 * 2 + local_ff0 * 2) * 4)
                          + 1;
              uVar46 = uVar46 + 1;
            } while (uVar46 < *(uint *)((long)pvVar10 + (long)pBVar37 * 4));
            local_ff0 = local_ff0 + uVar46;
            local_40 = uVar46;
          }
          puVar9 = (undefined1 *)0x0;
          if (pBVar37 != (BlockSplit *)0x0) {
            puVar9 = (undefined1 *)((long)&pBVar37[-1].lengths_alloc_size + 7);
          }
          uVar40 = local_fb0[(long)puVar9];
          uVar46 = (ulong)uVar40;
          local_fe8 = (HistogramCommand *)
                      BrotliHistogramBitCostDistanceCommand
                                ((HistogramCommand *)local_b40,out + uVar46);
          if (sVar25 != 0) {
            sVar47 = 0;
            do {
              dVar49 = BrotliHistogramBitCostDistanceCommand
                                 ((HistogramCommand *)local_b40,out + puVar21[sVar47]);
              if (dVar49 < (double)local_fe8) {
                uVar46 = (ulong)puVar21[sVar47];
                local_fe8 = (HistogramCommand *)dVar49;
              }
              uVar40 = (uint)uVar46;
              sVar47 = sVar47 + 1;
            } while (sVar25 != sVar47);
          }
          local_fb0[(long)pBVar37] = uVar40;
          if (*(int *)((long)pvVar13 + (ulong)uVar40 * 4) == -1) {
            *(int *)((long)pvVar13 + (ulong)uVar40 * 4) = iVar24;
            iVar24 = iVar24 + 1;
          }
          pBVar37 = (BlockSplit *)((long)&pBVar37->num_types + 1);
        } while (pBVar37 != in_stack_fffffffffffff000);
      }
      pBVar42 = pBVar51;
      BrotliFree((MemoryManager *)pBVar51,puVar21);
      BrotliFree((MemoryManager *)pBVar51,out);
      pBVar37 = (BlockSplit *)insert_and_copy_split->types_alloc_size;
      if (pBVar37 < in_stack_fffffffffffff000) {
        if (pBVar37 == (BlockSplit *)0x0) {
          pBVar37 = in_stack_fffffffffffff000;
        }
        do {
          pBVar19 = pBVar37;
          pBVar37 = (BlockSplit *)((long)pBVar19 * 2);
        } while (pBVar19 < in_stack_fffffffffffff000);
        if (pBVar19 == (BlockSplit *)0x0) {
          puVar8 = (uint8_t *)0x0;
        }
        else {
          puVar8 = (uint8_t *)BrotliAllocate((MemoryManager *)pBVar42,(size_t)pBVar19);
        }
        if (insert_and_copy_split->types_alloc_size != 0) {
          memcpy(puVar8,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree((MemoryManager *)pBVar42,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar8;
        insert_and_copy_split->types_alloc_size = (size_t)pBVar19;
      }
      pBVar37 = (BlockSplit *)insert_and_copy_split->lengths_alloc_size;
      if (pBVar37 < in_stack_fffffffffffff000) {
        if (pBVar37 == (BlockSplit *)0x0) {
          pBVar37 = in_stack_fffffffffffff000;
        }
        do {
          pBVar19 = pBVar37;
          pBVar37 = (BlockSplit *)((long)pBVar19 * 2);
        } while (pBVar19 < in_stack_fffffffffffff000);
        if (pBVar19 == (BlockSplit *)0x0) {
          puVar22 = (uint32_t *)0x0;
        }
        else {
          puVar22 = (uint32_t *)BrotliAllocate((MemoryManager *)pBVar42,(long)pBVar19 * 4);
        }
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          memcpy(puVar22,insert_and_copy_split->lengths,
                 insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree((MemoryManager *)pBVar42,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar22;
        insert_and_copy_split->lengths_alloc_size = (size_t)pBVar19;
      }
      uVar28 = 0;
      if (in_stack_fffffffffffff000 == (BlockSplit *)0x0) {
        sVar47 = 1;
        sVar25 = 0;
      }
      else {
        uVar40 = 0;
        sVar25 = 0;
        pBVar37 = (BlockSplit *)0x0;
        do {
          uVar28 = uVar28 + *(int *)((long)pvVar10 + (long)pBVar37 * 4);
          if (((BlockSplit *)((long)&in_stack_fffffffffffff000[-1].lengths_alloc_size + 7) ==
               pBVar37) ||
             (local_fb0[(long)pBVar37] != local_fb0[(long)((long)&pBVar37->num_types + 1)])) {
            uVar34 = uVar40 & 0xff;
            uVar3 = *(uint *)((long)pvVar13 + (ulong)local_fb0[(long)pBVar37] * 4);
            bVar35 = (byte)uVar3;
            insert_and_copy_split->types[sVar25] = bVar35;
            bVar33 = (byte)uVar40;
            uVar40 = uVar3;
            if (bVar35 < bVar33) {
              uVar40 = uVar34;
            }
            insert_and_copy_split->lengths[sVar25] = uVar28;
            sVar25 = sVar25 + 1;
            uVar28 = 0;
          }
          pBVar37 = (BlockSplit *)((long)&pBVar37->num_types + 1);
        } while (in_stack_fffffffffffff000 != pBVar37);
        sVar47 = (ulong)(uVar40 & 0xff) + 1;
      }
      insert_and_copy_split->num_blocks = sVar25;
      insert_and_copy_split->num_types = sVar47;
      pBVar51 = pBVar42;
      BrotliFree((MemoryManager *)pBVar42,pvVar13);
      BrotliFree((MemoryManager *)pBVar42,pvVar10);
      BrotliFree((MemoryManager *)pBVar42,local_fb0);
      BrotliFree((MemoryManager *)pBVar42,pvVar44);
    }
  }
  else {
    BrotliSplitBlockCommandsFromStored
              ((MemoryManager *)pBVar42,cmds,num_commands,pos,(size_t)pHVar38,insert_and_copy_split,
               cmds_block_splits_decoder,current_block_cmds);
  }
  BrotliFree((MemoryManager *)pBVar42,pvVar6);
  if (num_commands == 0) {
    puVar23 = (uint16_t *)0x0;
    sVar25 = 0;
    dVar49 = extraout_XMM0_Qa;
  }
  else {
    puVar23 = (uint16_t *)BrotliAllocate((MemoryManager *)pBVar42,num_commands * 2);
    puVar39 = &cmds->dist_prefix_;
    sVar25 = 0;
    do {
      if (((*(uint *)(puVar39 + -5) & 0x1ffffff) != 0) && (0x7f < puVar39[-1])) {
        puVar23[sVar25] = *puVar39 & 0x3ff;
        sVar25 = sVar25 + 1;
      }
      puVar39 = puVar39 + 8;
      num_commands = num_commands - 1;
      dVar49 = extraout_XMM0_Qa_00;
    } while (num_commands != 0);
  }
  sVar47 = 1;
  if (literals_block_splits_decoder == (BlockSplitFromDecoder *)0x0) {
    sVar47 = 0x32;
  }
  SplitByteVectorDistance
            ((MemoryManager *)pBVar42,puVar23,sVar25,sVar47,(size_t)params,(size_t)dist_split,dVar49
             ,pBVar51,in_stack_fffffffffffff000);
  BrotliFree((MemoryManager *)pBVar42,puVar23);
  return;
}

Assistant:

void BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split,
                      const BlockSplitFromDecoder* literals_block_splits_decoder,
                      size_t* current_block_literals,
                      const BlockSplitFromDecoder* cmds_block_splits_decoder,
                      size_t* current_block_cmds) {

  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literals)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);

    /* Create the block split on the array of literals.
-       Literal histograms have alphabet size 256.
       If have block splits from decoder then use them. */
    if (literals_block_splits_decoder == NULL) {
      SplitByteVectorLiteral(
          m, literals, literals_count,
          kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
          kLiteralStrideLength, kLiteralBlockSwitchCost, params,
          literal_split);
    } else {
      BrotliSplitBlockLiteralsFromStored(m, cmds, num_commands, pos, mask,
                                         literal_split,
                                         literals_block_splits_decoder,
                                         current_block_literals);
    }
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(insert_and_copy_codes)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }

    /* Create the block split on the array of command prefixes.
       If have block splits from decoder then use them. */
    if (cmds_block_splits_decoder == NULL) {
      SplitByteVectorCommand(
          m, insert_and_copy_codes, num_commands,
          kSymbolsPerCommandHistogram, kMaxCommandHistograms,
          kCommandStrideLength, kCommandBlockSwitchCost, params,
          insert_and_copy_split);
    } else {
      BrotliSplitBlockCommandsFromStored(m, cmds, num_commands, pos, mask,
                                         insert_and_copy_split,
                                         cmds_block_splits_decoder,
                                         current_block_cmds);
    }
    if (BROTLI_IS_OOM(m)) return;
    /* TODO: reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_prefixes)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    if (literals_block_splits_decoder == NULL) {
      SplitByteVectorDistance(
          m, distance_prefixes, j,
          kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
          kCommandStrideLength, kDistanceBlockSwitchCost, params,
          dist_split);
    } else {
      SplitByteVectorDistance(
          m, distance_prefixes, j,
          kSymbolsPerDistanceHistogram, 1,
          kCommandStrideLength, kDistanceBlockSwitchCost, params,
          dist_split);
    }
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}